

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void unqliteBitvecDestroy(Bitvec *p)

{
  sxu32 *psVar1;
  SyMemBackend *pBackend;
  bitvec_rec *pbVar2;
  sxu32 sVar3;
  bitvec_rec *pbVar4;
  
  pbVar4 = p->pList;
  pBackend = p->pAlloc;
  sVar3 = p->nRec;
  while (sVar3 != 0) {
    pbVar2 = pbVar4->pNext;
    SyMemBackendPoolFree(pBackend,pbVar4);
    psVar1 = &p->nRec;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) break;
    pbVar4 = pbVar2->pNext;
    SyMemBackendPoolFree(pBackend,pbVar2);
    psVar1 = &p->nRec;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) break;
    pbVar2 = pbVar4->pNext;
    SyMemBackendPoolFree(pBackend,pbVar4);
    psVar1 = &p->nRec;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) break;
    pbVar4 = pbVar2->pNext;
    SyMemBackendPoolFree(pBackend,pbVar2);
    sVar3 = p->nRec - 1;
    p->nRec = sVar3;
  }
  SyMemBackendFree(pBackend,p->apRec);
  SyMemBackendFree(pBackend,p);
  return;
}

Assistant:

UNQLITE_PRIVATE void unqliteBitvecDestroy(Bitvec *p)
{
	bitvec_rec *pNext,*pRec = p->pList;
	SyMemBackend *pAlloc = p->pAlloc;
	
	for(;;){
		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;

		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;


		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;


		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;
	}
	SyMemBackendFree(pAlloc,(void *)p->apRec);
	SyMemBackendFree(pAlloc,p);
}